

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

int number_of_parameter_constraints_in(CgreenVector *constraints)

{
  _Bool _Var1;
  int iVar2;
  Constraint *constraint;
  int iVar3;
  int position;
  
  iVar3 = 0;
  position = 0;
  while( true ) {
    iVar2 = cgreen_vector_size(constraints);
    if (iVar2 <= position) break;
    constraint = (Constraint *)cgreen_vector_get(constraints,position);
    _Var1 = is_comparing(constraint);
    iVar3 = iVar3 + (uint)_Var1;
    position = position + 1;
  }
  return iVar3;
}

Assistant:

int number_of_parameter_constraints_in(const CgreenVector* constraints) {
    int i, parameters = 0;

    for (i = 0; i < cgreen_vector_size(constraints); i++) {
        Constraint *constraint = (Constraint *)cgreen_vector_get(constraints, i);

        if (is_comparing(constraint)) {
           parameters++;
        }
    }

    return parameters;
}